

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_comment.cpp
# Opt level: O0

void __thiscall
Comment_BashInsideArray_Test::~Comment_BashInsideArray_Test(Comment_BashInsideArray_Test *this)

{
  Comment_BashInsideArray_Test *this_local;
  
  ~Comment_BashInsideArray_Test(this);
  operator_delete(this,0x338);
  return;
}

Assistant:

TEST_F (Comment, BashInsideArray) {
    using testing::_;
    EXPECT_CALL (callbacks_, begin_array ()).Times (1);
    EXPECT_CALL (callbacks_, uint64_value (_)).Times (2);
    EXPECT_CALL (callbacks_, end_array ()).Times (1);

    json::parser<decltype (proxy_)> p = json::make_parser (proxy_, json::extensions::bash_comments);
    p.input (R"([#comment
1,     # comment containing #
2 # comment
]
)"s)
        .eof ();
    EXPECT_FALSE (p.has_error ()) << "JSON error was: " << p.last_error ().message ();
}